

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O2

void wasm_module_imports(wasm_module_t *module,wasm_importtype_vec_t *out)

{
  pointer pIVar1;
  Module *pMVar2;
  wasm_importtype_t *this;
  size_t i;
  ulong uVar3;
  long lVar4;
  ImportType local_78;
  
  pMVar2 = wasm_ref_t::As<wabt::interp::Module>(&module->super_wasm_ref_t);
  lVar4 = 0;
  fprintf(_stderr,"CAPI: [%s] %zx\n","wasm_module_imports",
          ((long)(pMVar2->import_types_).
                 super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pMVar2->import_types_).
                super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  wasm_importtype_vec_new_uninitialized
            (out,((long)(pMVar2->import_types_).
                        super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pMVar2->import_types_).
                       super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x48);
  uVar3 = 0;
  while( true ) {
    pIVar1 = (pMVar2->import_types_).
             super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(((long)(pMVar2->import_types_).
                       super__Vector_base<wabt::interp::ImportType,_std::allocator<wabt::interp::ImportType>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)pIVar1) / 0x48) <= uVar3)
    break;
    this = (wasm_importtype_t *)operator_new(0x70);
    wabt::interp::ImportType::ImportType
              (&local_78,(ImportType *)((long)&(pIVar1->module)._M_dataplus._M_p + lVar4));
    wasm_importtype_t::wasm_importtype_t(this,&local_78);
    out->data[uVar3] = this;
    wabt::interp::ImportType::~ImportType(&local_78);
    uVar3 = uVar3 + 1;
    lVar4 = lVar4 + 0x48;
  }
  return;
}

Assistant:

void wasm_module_imports(const wasm_module_t* module,
                         own wasm_importtype_vec_t* out) {
  auto&& import_types = module->As<Module>()->import_types();
  TRACE("%" PRIzx, import_types.size());
  wasm_importtype_vec_new_uninitialized(out, import_types.size());

  for (size_t i = 0; i < import_types.size(); ++i) {
    out->data[i] = new wasm_importtype_t{import_types[i]};
  }
}